

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb::BitpackingFetchRow<duckdb::uhugeint_t>
               (ColumnSegment *segment,ColumnFetchState *state,row_t row_id,Vector *result,
               idx_t result_idx)

{
  uint64_t uVar1;
  unsigned_long skip_count;
  uhugeint_t *this;
  ulong uVar2;
  uhugeint_t uVar3;
  uhugeint_t multiplier;
  BitpackingScanState<duckdb::uhugeint_t,_duckdb::hugeint_t> scan_state;
  uhugeint_t local_80c0;
  uhugeint_t local_80b0;
  BitpackingScanState<duckdb::uhugeint_t,_duckdb::hugeint_t> local_80a0;
  
  BitpackingScanState<duckdb::uhugeint_t,_duckdb::hugeint_t>::BitpackingScanState
            (&local_80a0,segment);
  skip_count = NumericCastImpl<unsigned_long,_long,_false>::Convert(row_id);
  BitpackingScanState<duckdb::uhugeint_t,_duckdb::hugeint_t>::Skip(&local_80a0,segment,skip_count);
  this = (uhugeint_t *)(result->data + result_idx * 0x10);
  if (local_80a0.current_group.mode == CONSTANT_DELTA) {
    TryCast::Operation<unsigned_long,duckdb::uhugeint_t>
              (local_80a0.current_group_offset,&local_80c0,false);
    local_80b0 = uhugeint_t::operator*(&local_80c0,&local_80a0.current_constant);
    uVar3 = uhugeint_t::operator+(&local_80b0,&local_80a0.current_frame_of_reference);
    *this = uVar3;
  }
  else if (local_80a0.current_group.mode == CONSTANT) {
    this->lower = local_80a0.current_constant.lower;
    this->upper = local_80a0.current_constant.upper;
  }
  else {
    HugeIntPacker::Unpack
              ((uint32_t *)
               (local_80a0.current_group_ptr +
               ((ulong)local_80a0.current_width *
                (local_80a0.current_group_offset & 0xffffffffffffffe0) >> 3)),
               local_80a0.decompression_buffer,local_80a0.current_width);
    uVar2 = (ulong)(((uint)local_80a0.current_group_offset & 0x1f) << 4);
    uVar1 = *(uint64_t *)((long)&local_80a0.decompression_buffer[0].upper + uVar2);
    this->lower = *(uint64_t *)((long)&local_80a0.decompression_buffer[0].lower + uVar2);
    this->upper = uVar1;
    uhugeint_t::operator+=(this,&local_80a0.current_frame_of_reference);
    if (local_80a0.current_group.mode == DELTA_FOR) {
      uhugeint_t::operator+=(this,&local_80a0.current_delta_offset);
    }
  }
  BitpackingScanState<duckdb::uhugeint_t,_duckdb::hugeint_t>::~BitpackingScanState(&local_80a0);
  return;
}

Assistant:

void BitpackingFetchRow(ColumnSegment &segment, ColumnFetchState &state, row_t row_id, Vector &result,
                        idx_t result_idx) {
	BitpackingScanState<T> scan_state(segment);
	scan_state.Skip(segment, NumericCast<idx_t>(row_id));

	D_ASSERT(scan_state.current_group_offset < BITPACKING_METADATA_GROUP_SIZE);

	D_ASSERT(result.GetVectorType() == VectorType::FLAT_VECTOR);
	T *result_data = FlatVector::GetData<T>(result);
	T *current_result_ptr = result_data + result_idx;

	idx_t offset_in_compression_group =
	    scan_state.current_group_offset % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;

	data_ptr_t decompression_group_start_pointer =
	    scan_state.current_group_ptr +
	    (scan_state.current_group_offset - offset_in_compression_group) * scan_state.current_width / 8;

	//! Because FOR offsets all our values to be 0 or above, we can always skip sign extension here
	bool skip_sign_extend = true;

	if (scan_state.current_group.mode == BitpackingMode::CONSTANT) {
		*current_result_ptr = scan_state.current_constant;
		return;
	}

	if (scan_state.current_group.mode == BitpackingMode::CONSTANT_DELTA) {
		T multiplier;
		auto cast = TryCast::Operation<idx_t, T>(scan_state.current_group_offset, multiplier);
		(void)cast;
		D_ASSERT(cast);
#ifdef DEBUG
		// overflow check
		T result;
		bool multiply = TryMultiplyOperator::Operation(multiplier, scan_state.current_constant, result);
		bool add = TryAddOperator::Operation(result, scan_state.current_frame_of_reference, result);
		D_ASSERT(multiply && add);
#endif
		*current_result_ptr = (multiplier * scan_state.current_constant) + scan_state.current_frame_of_reference;
		return;
	}

	D_ASSERT(scan_state.current_group.mode == BitpackingMode::FOR ||
	         scan_state.current_group.mode == BitpackingMode::DELTA_FOR);

	BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(scan_state.decompression_buffer),
	                                     decompression_group_start_pointer, scan_state.current_width, skip_sign_extend);

	*current_result_ptr = scan_state.decompression_buffer[offset_in_compression_group];
	*current_result_ptr += scan_state.current_frame_of_reference;

	if (scan_state.current_group.mode == BitpackingMode::DELTA_FOR) {
		*current_result_ptr += scan_state.current_delta_offset;
	}
}